

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acecTree.c
# Opt level: O2

Vec_Int_t * Acec_TreeCarryMap(Gia_Man_t *p,Vec_Int_t *vAdds,Vec_Wec_t *vBoxes)

{
  int Entry;
  int i;
  Vec_Int_t *p_00;
  Vec_Int_t *p_01;
  int i_00;
  int i_01;
  
  p_00 = Vec_IntStartFull(p->nObjs);
  for (i_00 = 0; i_00 < vBoxes->nSize; i_00 = i_00 + 1) {
    p_01 = Vec_WecEntry(vBoxes,i_00);
    for (i_01 = 0; i_01 < p_01->nSize; i_01 = i_01 + 1) {
      Entry = Vec_IntEntry(p_01,i_01);
      i = Vec_IntEntry(vAdds,Entry * 6 + 4);
      Vec_IntWriteEntry(p_00,i,Entry);
    }
  }
  return p_00;
}

Assistant:

Vec_Int_t * Acec_TreeCarryMap( Gia_Man_t * p, Vec_Int_t * vAdds, Vec_Wec_t * vBoxes )
{
    Vec_Int_t * vMap = Vec_IntStartFull( Gia_ManObjNum(p) );
    Vec_Int_t * vLevel;
    int i, k, Box;
    Vec_WecForEachLevel( vBoxes, vLevel, i )
        Vec_IntForEachEntry( vLevel, Box, k )
            Vec_IntWriteEntry( vMap, Vec_IntEntry(vAdds, 6*Box+4), Box );
    return vMap;
}